

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qproperty.cpp
# Opt level: O3

void QtPrivate::BindableWarnings::printMetaTypeMismatch(QMetaType actual,QMetaType expected)

{
  char *pcVar1;
  undefined8 uVar2;
  storage_type *in_RCX;
  char *pcVar3;
  QString *pQVar4;
  long in_FS_OFFSET;
  QByteArrayView ba;
  QByteArrayView ba_00;
  QByteArrayView ba_01;
  QByteArrayView ba_02;
  QByteArrayView ba_03;
  undefined1 local_40 [32];
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  lcQPropertyBinding();
  if (((byte)lcQPropertyBinding::category.field_2.bools.enabledWarning._q_value._M_base._M_i & 1) !=
      0) {
    QMessageLogger::warning((QMessageLogger *)local_40);
    uVar2 = local_40._0_8_;
    ba.m_data = in_RCX;
    ba.m_size = (qsizetype)
                "setBinding: Could not set binding as the property expects it to be of type";
    QString::fromUtf8((QString *)(local_40 + 8),(QString *)0x4a,ba);
    ::QTextStream::operator<<((QTextStream *)uVar2,(QString *)(local_40 + 8));
    if ((QArrayData *)local_40._8_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_40._8_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_40._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_40._8_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_40._8_8_,2,0x10);
      }
    }
    if (*(bool *)(local_40._0_8_ + 0x30) == true) {
      ::QTextStream::operator<<((QTextStream *)local_40._0_8_,' ');
    }
    uVar2 = local_40._0_8_;
    if ((actual.d_ptr == (QMetaTypeInterface *)0x0) ||
       (pcVar3 = (actual.d_ptr)->name, pcVar3 == (char *)0x0)) {
      pcVar3 = (char *)0x0;
      pQVar4 = (QString *)0x0;
    }
    else {
      pQVar4 = (QString *)0xffffffffffffffff;
      do {
        pcVar1 = pcVar3 + 1 + (long)pQVar4;
        pQVar4 = (QString *)((long)&(pQVar4->d).d + 1);
      } while (*pcVar1 != '\0');
    }
    ba_00.m_data = in_RCX;
    ba_00.m_size = (qsizetype)pcVar3;
    QString::fromUtf8((QString *)(local_40 + 8),pQVar4,ba_00);
    ::QTextStream::operator<<((QTextStream *)uVar2,(QString *)(local_40 + 8));
    if ((QArrayData *)local_40._8_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_40._8_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_40._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_40._8_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_40._8_8_,2,0x10);
      }
    }
    if (*(bool *)(local_40._0_8_ + 0x30) == true) {
      ::QTextStream::operator<<((QTextStream *)local_40._0_8_,' ');
    }
    uVar2 = local_40._0_8_;
    ba_01.m_data = in_RCX;
    ba_01.m_size = (qsizetype)"but got";
    QString::fromUtf8((QString *)(local_40 + 8),(QString *)&DAT_00000007,ba_01);
    ::QTextStream::operator<<((QTextStream *)uVar2,(QString *)(local_40 + 8));
    if ((QArrayData *)local_40._8_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_40._8_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_40._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_40._8_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_40._8_8_,2,0x10);
      }
    }
    if (*(bool *)(local_40._0_8_ + 0x30) == true) {
      ::QTextStream::operator<<((QTextStream *)local_40._0_8_,' ');
    }
    uVar2 = local_40._0_8_;
    if ((expected.d_ptr == (QMetaTypeInterface *)0x0) ||
       (pcVar3 = (expected.d_ptr)->name, pcVar3 == (char *)0x0)) {
      pcVar3 = (char *)0x0;
      pQVar4 = (QString *)0x0;
    }
    else {
      pQVar4 = (QString *)0xffffffffffffffff;
      do {
        pcVar1 = pcVar3 + 1 + (long)pQVar4;
        pQVar4 = (QString *)((long)&(pQVar4->d).d + 1);
      } while (*pcVar1 != '\0');
    }
    ba_02.m_data = in_RCX;
    ba_02.m_size = (qsizetype)pcVar3;
    QString::fromUtf8((QString *)(local_40 + 8),pQVar4,ba_02);
    ::QTextStream::operator<<((QTextStream *)uVar2,(QString *)(local_40 + 8));
    if ((QArrayData *)local_40._8_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_40._8_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_40._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_40._8_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_40._8_8_,2,0x10);
      }
    }
    if (*(bool *)(local_40._0_8_ + 0x30) == true) {
      ::QTextStream::operator<<((QTextStream *)local_40._0_8_,' ');
    }
    uVar2 = local_40._0_8_;
    ba_03.m_data = in_RCX;
    ba_03.m_size = (qsizetype)"instead.";
    QString::fromUtf8((QString *)(local_40 + 8),(QString *)0x8,ba_03);
    ::QTextStream::operator<<((QTextStream *)uVar2,(QString *)(local_40 + 8));
    if ((QArrayData *)local_40._8_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_40._8_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_40._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_40._8_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_40._8_8_,2,0x10);
      }
    }
    if (*(bool *)(local_40._0_8_ + 0x30) == true) {
      ::QTextStream::operator<<((QTextStream *)local_40._0_8_,' ');
    }
    QDebug::~QDebug((QDebug *)local_40);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_20) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void printMetaTypeMismatch(QMetaType actual, QMetaType expected)
{
    qCWarning(lcQPropertyBinding) << "setBinding: Could not set binding as the property expects it to be of type"
                                  << actual.name()
                                  << "but got" << expected.name() << "instead.";
}